

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

bool GetCScript(SigningProvider *provider,SignatureData *sigdata,CScriptID *scriptid,CScript *script
               )

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  base_blob<160U> local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*provider->_vptr_SigningProvider[2])(provider,scriptid,script);
  bVar3 = true;
  if ((char)iVar2 == '\0') {
    other = &(sigdata->redeem_script).super_CScriptBase;
    CScriptID::CScriptID((CScriptID *)&local_4c,(CScript *)other);
    bVar1 = operator==(&local_4c,(base_blob<160U> *)scriptid);
    if (!bVar1) {
      other = &(sigdata->witness_script).super_CScriptBase;
      CScriptID::CScriptID((CScriptID *)&local_4c,(CScript *)other);
      bVar1 = operator==(&local_4c,(base_blob<160U> *)scriptid);
      if (!bVar1) {
        bVar3 = false;
        goto LAB_00185fa6;
      }
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=(&script->super_CScriptBase,other);
  }
LAB_00185fa6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool GetCScript(const SigningProvider& provider, const SignatureData& sigdata, const CScriptID& scriptid, CScript& script)
{
    if (provider.GetCScript(scriptid, script)) {
        return true;
    }
    // Look for scripts in SignatureData
    if (CScriptID(sigdata.redeem_script) == scriptid) {
        script = sigdata.redeem_script;
        return true;
    } else if (CScriptID(sigdata.witness_script) == scriptid) {
        script = sigdata.witness_script;
        return true;
    }
    return false;
}